

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_e2e2::MovieState::prepare(MovieState *this)

{
  _Head_base<0UL,_AVIOContext_*,_false> _Var1;
  AVFormatContext *pAVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  pointer *__ptr;
  _Head_base<0UL,_AVFormatContext_*,_false> _Var6;
  AVFormatContext *fmtctx;
  AVIOContext *avioctx;
  AVIOInterruptCB intcb;
  _Head_base<0UL,_AVFormatContext_*,_false> local_48;
  thread local_40;
  _Head_base<0UL,_AVFormatContext_*,_false> local_38;
  _Head_base<0UL,_AVIOContext_*,_false> local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_30._M_head_impl = (AVIOContext *)0x0;
  local_28 = decode_interrupt_cb;
  uStack_20 = this;
  iVar3 = avio_open2(&local_30,(this->mFilename)._M_dataplus._M_p,1,&local_28,0);
  if (iVar3 == 0) {
    _Var1._M_head_impl =
         (this->mIOContext)._M_t.
         super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>._M_t.
         super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>.
         super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl;
    (this->mIOContext)._M_t.
    super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>._M_t.
    super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>.
    super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl = local_30._M_head_impl;
    if (_Var1._M_head_impl != (AVIOContext *)0x0) {
      local_48._M_head_impl = (AVFormatContext *)_Var1._M_head_impl;
      avio_closep();
    }
    local_38._M_head_impl = (AVFormatContext *)avformat_alloc_context();
    (local_38._M_head_impl)->pb =
         (this->mIOContext)._M_t.
         super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>._M_t.
         super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>.
         super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl;
    *(undefined4 *)&((local_38._M_head_impl)->interrupt_callback).callback = (undefined4)local_28;
    *(undefined4 *)((long)&((local_38._M_head_impl)->interrupt_callback).callback + 4) =
         local_28._4_4_;
    *(undefined4 *)&((local_38._M_head_impl)->interrupt_callback).opaque = (undefined4)uStack_20;
    *(undefined4 *)((long)&((local_38._M_head_impl)->interrupt_callback).opaque + 4) =
         uStack_20._4_4_;
    iVar3 = avformat_open_input(&local_38,(this->mFilename)._M_dataplus._M_p,0,0);
    if (iVar3 == 0) {
      pAVar2 = (this->mFormatCtx)._M_t.
               super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>.
               _M_t.
               super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
               super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl;
      (this->mFormatCtx)._M_t.
      super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
      super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
      super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl = local_38._M_head_impl;
      _Var6._M_head_impl = local_38._M_head_impl;
      if (pAVar2 != (AVFormatContext *)0x0) {
        local_48._M_head_impl = pAVar2;
        avformat_close_input();
        _Var6._M_head_impl =
             (this->mFormatCtx)._M_t.
             super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
             super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
             super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl;
      }
      iVar3 = avformat_find_stream_info(_Var6._M_head_impl,0);
      if (-1 < iVar3) {
        av_dump_format((this->mFormatCtx)._M_t.
                       super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                       .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl,0,
                       (this->mFilename)._M_dataplus._M_p,0);
        local_40._M_id._M_thread = (id)0;
        local_48._M_head_impl = (AVFormatContext *)operator_new(0x20);
        (local_48._M_head_impl)->av_class = (AVClass *)&PTR___State_0010ece0;
        (local_48._M_head_impl)->iformat = (AVInputFormat *)this;
        (local_48._M_head_impl)->oformat = (AVOutputFormat *)parse_handler;
        (local_48._M_head_impl)->priv_data = (void *)0x0;
        std::thread::_M_start_thread(&local_40,&local_48,0);
        if (local_48._M_head_impl != (AVFormatContext *)0x0) {
          (**(code **)((local_48._M_head_impl)->av_class + 8))();
        }
        if ((this->mParseThread)._M_id._M_thread == 0) {
          (this->mParseThread)._M_id._M_thread = (native_handle_type)local_40._M_id._M_thread;
          return true;
        }
        std::terminate();
      }
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->mFilename)._M_dataplus._M_p,
                          (this->mFilename)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": failed to find stream info",0x1c)
      ;
      lVar5 = *(long *)poVar4;
      goto LAB_0010618d;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to open ",0xf);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->mFilename)._M_dataplus._M_p,
                      (this->mFilename)._M_string_length);
  lVar5 = *(long *)poVar4;
LAB_0010618d:
  std::ios::widen((char)*(undefined8 *)(lVar5 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return false;
}

Assistant:

bool MovieState::prepare()
{
    AVIOContext *avioctx{nullptr};
    AVIOInterruptCB intcb{decode_interrupt_cb, this};
    if(avio_open2(&avioctx, mFilename.c_str(), AVIO_FLAG_READ, &intcb, nullptr))
    {
        std::cerr<< "Failed to open "<<mFilename <<std::endl;
        return false;
    }
    mIOContext.reset(avioctx);

    /* Open movie file. If avformat_open_input fails it will automatically free
     * this context, so don't set it onto a smart pointer yet.
     */
    AVFormatContext *fmtctx{avformat_alloc_context()};
    fmtctx->pb = mIOContext.get();
    fmtctx->interrupt_callback = intcb;
    if(avformat_open_input(&fmtctx, mFilename.c_str(), nullptr, nullptr) != 0)
    {
        std::cerr<< "Failed to open "<<mFilename <<std::endl;
        return false;
    }
    mFormatCtx.reset(fmtctx);

    /* Retrieve stream information */
    if(avformat_find_stream_info(mFormatCtx.get(), nullptr) < 0)
    {
        std::cerr<< mFilename<<": failed to find stream info" <<std::endl;
        return false;
    }

    /* Dump information about file onto standard error */
    av_dump_format(mFormatCtx.get(), 0, mFilename.c_str(), 0);

    mParseThread = std::thread{std::mem_fn(&MovieState::parse_handler), this};
    return true;
}